

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O3

exr_result_t
exr_attr_opaquedata_unpack(exr_context_t ctxt,exr_attr_opaquedata_t *u,int32_t *sz,void **unpacked)

{
  void *pvVar1;
  exr_result_t eVar2;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  int32_t tmpusz;
  void *tmpuptr;
  int32_t local_24;
  void *local_20;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (sz != (int32_t *)0x0) {
    *sz = 0;
  }
  if (unpacked != (void **)0x0) {
    *unpacked = (void *)0x0;
  }
  if (u == (exr_attr_opaquedata_t *)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar3 = "Invalid reference to opaque data object to initialize";
LAB_0011b1b1:
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar3);
    return eVar2;
  }
  pvVar1 = u->unpacked_data;
  if (pvVar1 == (void *)0x0) {
    if (u->unpack_func_ptr ==
        (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
      pcVar3 = "No unpack provider specified for opaque data";
      goto LAB_0011b1b1;
    }
    eVar2 = (*u->unpack_func_ptr)(ctxt,u->packed_data,u->size,&local_24,&local_20);
    if (eVar2 != 0) {
      return eVar2;
    }
    u->unpacked_size = local_24;
    u->unpacked_data = local_20;
    if (sz == (int32_t *)0x0) goto LAB_0011b18b;
  }
  else {
    local_20 = pvVar1;
    if (sz == (int32_t *)0x0) goto LAB_0011b18b;
    local_24 = u->unpacked_size;
  }
  *sz = local_24;
LAB_0011b18b:
  if (unpacked != (void **)0x0) {
    *unpacked = local_20;
  }
  return 0;
}

Assistant:

exr_result_t
exr_attr_opaquedata_unpack (
    exr_context_t ctxt, exr_attr_opaquedata_t* u, int32_t* sz, void** unpacked)
{
    exr_result_t rv;
    int32_t      tmpusz;
    void*        tmpuptr;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (sz) *sz = 0;
    if (unpacked) *unpacked = NULL;

    if (!u)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to opaque data object to initialize");

    if (u->unpacked_data)
    {
        if (sz) *sz = u->unpacked_size;
        if (unpacked) *unpacked = u->unpacked_data;
        return EXR_ERR_SUCCESS;
    }

    if (!u->unpack_func_ptr)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No unpack provider specified for opaque data");
    rv = u->unpack_func_ptr (
        ctxt, u->packed_data, u->size, &(tmpusz), &(tmpuptr));
    if (rv == EXR_ERR_SUCCESS)
    {
        u->unpacked_size = tmpusz;
        u->unpacked_data = tmpuptr;
        if (sz) *sz = tmpusz;
        if (unpacked) *unpacked = tmpuptr;
    }

    return rv;
}